

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_qlist_insert(void)

{
  int iVar1;
  QLIST_NODE *pQVar2;
  QDATA *pQVar3;
  QLIST_NODE *pQVar4;
  int n;
  QDATA xxx;
  QDATA *data;
  QLIST_NODE *node;
  QLIST list;
  QLIST_NODE *in_stack_ffffffffffffffa8;
  QLIST *in_stack_ffffffffffffffb0;
  int local_34;
  QLIST_NODE QStack_28;
  QLIST_NODE *local_20;
  QLIST_NODE *local_18;
  QLIST local_10;
  
  qlist_init(&local_10);
  alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_prepend(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_prepend(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar2 = qlist_head(&local_10);
  pQVar3 = alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_insert_after(&local_10,pQVar2,&pQVar3->list_node);
  alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_prepend(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar2 = qlist_head(&local_10);
  pQVar3 = alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_insert_after(&local_10,pQVar2,&pQVar3->list_node);
  pQVar3 = alloc_qdata((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  qlist_append(&local_10,&pQVar3->list_node);
  qlist_prepend(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  qlist_remove_head((QLIST *)0x10569d);
  pQVar2 = qlist_head(&local_10);
  qlist_insert_after(&local_10,pQVar2,&QStack_28);
  pQVar2 = qlist_head(&local_10);
  qlist_remove(&local_10,pQVar2,&QStack_28);
  local_18 = qlist_head(&local_10);
  local_34 = 1;
  while( true ) {
    pQVar2 = local_18;
    pQVar4 = qlist_end(&local_10);
    if (pQVar2 == pQVar4) break;
    local_20 = local_18 + -1;
    acutest_check_((int)(ulong)(*(int *)&local_20->n == local_34),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x160,"%s","data->value == n");
    local_18 = qlist_next(local_18);
    local_34 = local_34 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = qlist_is_empty(&local_10);
    if (iVar1 != 0) break;
    local_18 = qlist_head(&local_10);
    qlist_remove_head((QLIST *)0x1057b3);
    free(local_18 + -1);
    local_34 = local_34 + 1;
  }
  acutest_check_((int)(ulong)(local_34 == 6),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x16b,"%s","n == 6");
  return;
}

Assistant:

static void
test_qlist_insert(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    QDATA xxx;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_prepend(&list, &alloc_qdata(5)->list_node);                           /* 5 */
    qlist_prepend(&list, &alloc_qdata(3)->list_node);                           /* 3 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(4)->list_node);   /* 3 -> 4 -> 5 */
    qlist_prepend(&list, &alloc_qdata(1)->list_node);                           /* 1 -> 3 -> 4 -> 5 */
    qlist_insert_after(&list, qlist_head(&list), &alloc_qdata(2)->list_node);   /* 1 -> 2 -> 3 -> 4 -> 5 */
    qlist_append(&list, &alloc_qdata(6)->list_node);                            /* 1 -> 2 -> 3 -> 4 -> 5 -> 6 */

    /* Verify that removals do not break integrity. */
    xxx.value = 666;
    qlist_prepend(&list, &xxx.list_node);
    qlist_remove_head(&list);
    qlist_insert_after(&list, qlist_head(&list), &xxx.list_node);
    qlist_remove(&list, qlist_head(&list), &xxx.list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 6);
}